

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Dmc::run(Nes_Dmc *this,nes_time_t time,nes_time_t end_time)

{
  Blip_Buffer *pBVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  Nes_Dmc *in_RDI;
  int step;
  int dac;
  int bits;
  int period;
  Blip_Buffer *output;
  int count;
  int bits_remain;
  int delta;
  int in_stack_ffffffffffffffb8;
  blip_time_t in_stack_ffffffffffffffbc;
  int local_34;
  uint local_30;
  int local_18;
  int local_c;
  
  iVar2 = Nes_Osc::update_amp(&in_RDI->super_Nes_Osc,in_RDI->dac);
  if (*(Blip_Buffer **)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->last_amp == (Blip_Buffer *)0x0) {
    in_RDI->silence = true;
  }
  else {
    Blip_Buffer::set_modified(*(Blip_Buffer **)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->last_amp);
    if (iVar2 != 0) {
      Blip_Synth<8,_1>::offset
                ((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 (Blip_Buffer *)0x82e4a2);
    }
  }
  local_c = *(int *)((long)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->volume_unit_ + 4) + in_ESI;
  if (local_c < in_EDX) {
    local_18 = in_RDI->bits_remain;
    if (((in_RDI->silence & 1U) == 0) || ((in_RDI->buf_full & 1U) != 0)) {
      pBVar1 = *(Blip_Buffer **)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->last_amp;
      iVar2 = in_RDI->period;
      local_30 = in_RDI->bits;
      local_34 = in_RDI->dac;
      do {
        if ((in_RDI->silence & 1U) == 0) {
          iVar3 = (local_30 & 1) * 4 + -2;
          local_30 = (int)local_30 >> 1;
          if ((uint)(local_34 + iVar3) < 0x80) {
            local_34 = iVar3 + local_34;
            Blip_Synth<8,_1>::offset_inline
                      ((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffbc,
                       in_stack_ffffffffffffffb8,(Blip_Buffer *)0x82e5bb);
          }
        }
        local_c = iVar2 + local_c;
        local_18 = local_18 + -1;
        if (local_18 == 0) {
          local_18 = 8;
          if ((in_RDI->buf_full & 1U) == 0) {
            in_RDI->silence = true;
          }
          else {
            in_RDI->silence = false;
            local_30 = in_RDI->buf;
            in_RDI->buf_full = false;
            if (pBVar1 == (Blip_Buffer *)0x0) {
              in_RDI->silence = true;
            }
            fill_buffer(in_RDI);
          }
        }
      } while (local_c < in_EDX);
      in_RDI->dac = local_34;
      *(int *)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->impulses = local_34;
      in_RDI->bits = local_30;
    }
    else {
      iVar2 = ((in_EDX - local_c) + in_RDI->period + -1) / in_RDI->period;
      local_18 = ((local_18 + 7) - iVar2 % 8) % 8 + 1;
      local_c = iVar2 * in_RDI->period + local_c;
    }
    in_RDI->bits_remain = local_18;
  }
  *(int *)((long)&((Blip_Synth_ *)&in_RDI->super_Nes_Osc)->volume_unit_ + 4) = local_c - in_EDX;
  return;
}

Assistant:

void Nes_Dmc::run( nes_time_t time, nes_time_t end_time )
{
	int delta = update_amp( dac );
	if ( !output )
	{
		silence = true;
	}
	else
	{
		output->set_modified();
		if ( delta )
			synth.offset( time, delta, output );
	}
	
	time += delay;
	if ( time < end_time )
	{
		int bits_remain = this->bits_remain;
		if ( silence && !buf_full )
		{
			int count = (end_time - time + period - 1) / period;
			bits_remain = (bits_remain - 1 + 8 - (count % 8)) % 8 + 1;
			time += count * period;
		}
		else
		{
			Blip_Buffer* const output = this->output;
			const int period = this->period;
			int bits = this->bits;
			int dac = this->dac;
			
			do
			{
				if ( !silence )
				{
					int step = (bits & 1) * 4 - 2;
					bits >>= 1;
					if ( unsigned (dac + step) <= 0x7F ) {
						dac += step;
						synth.offset_inline( time, step, output );
					}
				}
				
				time += period;
				
				if ( --bits_remain == 0 )
				{
					bits_remain = 8;
					if ( !buf_full ) {
						silence = true;
					}
					else {
						silence = false;
						bits = buf;
						buf_full = false;
						if ( !output )
							silence = true;
						fill_buffer();
					}
				}
			}
			while ( time < end_time );
			
			this->dac = dac;
			this->last_amp = dac;
			this->bits = bits;
		}
		this->bits_remain = bits_remain;
	}
	delay = time - end_time;
}